

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptSubpassInputType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  const_reference pvVar2;
  TBasicType local_180;
  TType local_168;
  TSampler local_d0;
  TBasicType local_cc;
  TSampler sampler;
  TBasicType subpassBasicType;
  TBasicType basicRetType;
  TType subpassType;
  bool multisample;
  EHlslTokenClass subpassInputType;
  TType *type_local;
  HlslGrammar *this_local;
  
  subpassType.spirvType._4_4_ = HlslTokenStream::peek(&this->super_HlslTokenStream);
  if (subpassType.spirvType._4_4_ == EHTokSubpassInput) {
    subpassType.spirvType._3_1_ = 0;
  }
  else {
    if (subpassType.spirvType._4_4_ != EHTokSubpassInputMS) {
      return false;
    }
    subpassType.spirvType._3_1_ = 1;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  TType::TType((TType *)&basicRetType,EbtFloat,EvqUniform,4,0,0,false);
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (bVar1) {
    bVar1 = acceptType(this,(TType *)&basicRetType);
    if (!bVar1) {
      expected(this,"scalar or vector type");
      this_local._7_1_ = false;
      goto LAB_00677dee;
    }
    sampler = (TSampler)TType::getBasicType((TType *)&basicRetType);
    if (((sampler != (TSampler)0x1) && (1 < (int)sampler - EbtInt)) && (sampler != (TSampler)0xf)) {
      unimplemented(this,"basic type in subpass input");
      this_local._7_1_ = false;
      goto LAB_00677dee;
    }
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
    if (!bVar1) {
      expected(this,"right angle bracket");
      this_local._7_1_ = false;
      goto LAB_00677dee;
    }
  }
  bVar1 = TType::isStruct((TType *)&basicRetType);
  if (bVar1) {
    this_00 = &TType::getStruct((TType *)&basicRetType)->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar2 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (this_00,0);
    local_180 = (*pvVar2->type->_vptr_TType[7])();
  }
  else {
    local_180 = TType::getBasicType((TType *)&basicRetType);
  }
  local_cc = local_180;
  TSampler::setSubpass(&local_d0,local_180,(bool)(subpassType.spirvType._3_1_ & 1));
  bVar1 = HlslParseContext::setTextureReturnType
                    (this->parseContext,&local_d0,(TType *)&basicRetType,
                     &(this->super_HlslTokenStream).token.loc);
  if (bVar1) {
    TType::TType(&local_168,&local_d0,EvqUniform,(TArraySizes *)0x0);
    TType::shallowCopy(type,&local_168);
    TType::~TType(&local_168);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_00677dee:
  TType::~TType((TType *)&basicRetType);
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptSubpassInputType(TType& type)
{
    // read subpass type
    const EHlslTokenClass subpassInputType = peek();

    bool multisample;

    switch (subpassInputType) {
    case EHTokSubpassInput:   multisample = false; break;
    case EHTokSubpassInputMS: multisample = true;  break;
    default:
        return false;  // not a subpass input declaration
    }

    advanceToken();  // consume the sampler type keyword

    TType subpassType(EbtFloat, EvqUniform, 4); // default type is float4

    if (acceptTokenClass(EHTokLeftAngle)) {
        if (! acceptType(subpassType)) {
            expected("scalar or vector type");
            return false;
        }

        const TBasicType basicRetType = subpassType.getBasicType() ;

        switch (basicRetType) {
        case EbtFloat:
        case EbtUint:
        case EbtInt:
        case EbtStruct:
            break;
        default:
            unimplemented("basic type in subpass input");
            return false;
        }

        if (! acceptTokenClass(EHTokRightAngle)) {
            expected("right angle bracket");
            return false;
        }
    }

    const TBasicType subpassBasicType = subpassType.isStruct() ? (*subpassType.getStruct())[0].type->getBasicType()
        : subpassType.getBasicType();

    TSampler sampler;
    sampler.setSubpass(subpassBasicType, multisample);

    // Remember the declared return type.  Function returns false on error.
    if (!parseContext.setTextureReturnType(sampler, subpassType, token.loc))
        return false;

    type.shallowCopy(TType(sampler, EvqUniform));

    return true;
}